

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O1

int run_test_threadpool_cancel_getaddrinfo(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uv_sem_t *req;
  uv_sem_t *puVar4;
  code *addr;
  long extraout_RDX;
  long extraout_RDX_00;
  undefined1 *extraout_RDX_01;
  uv_work_t *req_00;
  uint uVar5;
  int iVar6;
  uv_work_t *puVar7;
  uv_sem_t *puVar8;
  uv_getnameinfo_t *puVar9;
  uv_random_t *req_01;
  long lVar10;
  long lVar11;
  addrinfo hints;
  cancel_info ci;
  uv_getaddrinfo_t reqs [4];
  uv_timer_t uStack_2310;
  uv_work_t auStack_2278 [16];
  uv_loop_t *puStack_1a70;
  code *pcStack_1a68;
  uv_sem_t *puStack_1a60;
  uv_sem_t *puStack_1a58;
  code *pcStack_1a50;
  undefined1 auStack_1a40 [176];
  code *pcStack_1990;
  sockaddr_in sStack_1980;
  uv_sem_t *puStack_1970;
  void *pvStack_1968;
  uv_sem_t auStack_1960 [4];
  uv_sem_t auStack_18c8 [41];
  uv_getnameinfo_t uStack_13a0;
  uv_getnameinfo_t uStack_e78;
  uv_getnameinfo_t uStack_950;
  uv_sem_t *puStack_420;
  uv_sem_t *puStack_418;
  uv_work_t *puStack_410;
  uv_sem_t *puStack_408;
  code *pcStack_400;
  code *pcStack_3f8;
  char acStack_3f0 [72];
  uv_loop_t *puStack_3a8;
  addrinfo local_370;
  uv_getaddrinfo_t *local_340;
  undefined8 local_338;
  uv_timer_t local_330;
  uv_getaddrinfo_t local_298;
  uv_getaddrinfo_t local_1f8;
  uv_getaddrinfo_t local_158;
  uv_getaddrinfo_t local_b8;
  
  local_338 = 0xa000000004;
  local_340 = &local_298;
  puVar2 = uv_default_loop();
  saturate_threadpool();
  iVar1 = uv_getaddrinfo(puVar2,&local_298,getaddrinfo_cb,"fail",(char *)0x0,(addrinfo *)0x0);
  if (iVar1 == 0) {
    iVar1 = uv_getaddrinfo(puVar2,&local_1f8,getaddrinfo_cb,(char *)0x0,"fail",(addrinfo *)0x0);
    if (iVar1 != 0) goto LAB_0017324a;
    iVar1 = uv_getaddrinfo(puVar2,&local_158,getaddrinfo_cb,"fail","fail",(addrinfo *)0x0);
    if (iVar1 != 0) goto LAB_0017324f;
    iVar1 = uv_getaddrinfo(puVar2,&local_b8,getaddrinfo_cb,"fail",(char *)0x0,&local_370);
    if (iVar1 != 0) goto LAB_00173254;
    iVar1 = uv_timer_init(puVar2,&local_330);
    if (iVar1 != 0) goto LAB_00173259;
    iVar1 = uv_timer_start(&local_330,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_0017325e;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00173263;
    if (timer_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017326d;
    }
  }
  else {
    run_test_threadpool_cancel_getaddrinfo_cold_1();
LAB_0017324a:
    run_test_threadpool_cancel_getaddrinfo_cold_2();
LAB_0017324f:
    run_test_threadpool_cancel_getaddrinfo_cold_3();
LAB_00173254:
    run_test_threadpool_cancel_getaddrinfo_cold_4();
LAB_00173259:
    run_test_threadpool_cancel_getaddrinfo_cold_5();
LAB_0017325e:
    run_test_threadpool_cancel_getaddrinfo_cold_6();
LAB_00173263:
    run_test_threadpool_cancel_getaddrinfo_cold_7();
  }
  run_test_threadpool_cancel_getaddrinfo_cold_8();
LAB_0017326d:
  run_test_threadpool_cancel_getaddrinfo_cold_9();
  lVar10 = 0;
  addr = (code *)0x4;
  pcStack_3f8 = (code *)0x1732a1;
  puStack_3a8 = puVar2;
  snprintf(acStack_3f0,0x40,"UV_THREADPOOL_SIZE=%lu");
  pcStack_3f8 = (code *)0x1732a9;
  putenv(acStack_3f0);
  req_00 = pause_reqs;
  pcStack_3f8 = (code *)0x1732b5;
  req = (uv_sem_t *)uv_default_loop();
  while( true ) {
    puVar4 = (uv_sem_t *)((long)pause_sems + lVar10);
    iVar6 = 0;
    pcStack_3f8 = (code *)0x1732dd;
    iVar1 = uv_sem_init(puVar4,0);
    if (iVar1 != 0) break;
    addr = done_cb;
    pcStack_3f8 = (code *)0x1732f2;
    puVar7 = req_00;
    puVar4 = req;
    iVar1 = uv_queue_work((uv_loop_t *)req,req_00,work_cb,done_cb);
    iVar6 = (int)puVar7;
    if (iVar1 != 0) {
      pcStack_3f8 = (code *)0x173316;
      saturate_threadpool_cold_2();
      break;
    }
    lVar10 = lVar10 + 0x20;
    req_00 = req_00 + 1;
    if (lVar10 == 0x80) {
      return 0;
    }
  }
  pcStack_3f8 = getaddrinfo_cb;
  saturate_threadpool_cold_1();
  if (iVar6 == -0xbbb) {
    if (extraout_RDX == 0) {
      uv_freeaddrinfo((addrinfo *)0x0);
      return extraout_EAX;
    }
  }
  else {
    pcStack_400 = (code *)0x173336;
    getaddrinfo_cb_cold_1();
  }
  pcStack_400 = timer_cb;
  getaddrinfo_cb_cold_2();
  pcStack_400 = (code *)0x80;
  puStack_410 = req_00;
  puStack_408 = req;
  if (*(int *)((long)puVar4 + -8) == 0) {
LAB_00173364:
    lVar10 = 0;
    puStack_418 = (uv_sem_t *)0x173371;
    uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
    do {
      puStack_418 = (uv_sem_t *)0x173381;
      uv_sem_post((uv_sem_t *)((long)pause_sems + lVar10));
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x80);
    timer_cb_called = timer_cb_called + 1;
    return extraout_EAX_00;
  }
  uVar5 = 0;
  while( true ) {
    puStack_418 = (uv_sem_t *)0x173359;
    iVar1 = uv_cancel((uv_req_t *)
                      ((ulong)(*(int *)((long)puVar4 + -4) * uVar5) +
                      *(long *)((long)puVar4 + -0x10)));
    if (iVar1 != 0) break;
    uVar5 = uVar5 + 1;
    if (*(uint *)((long)puVar4 + -8) <= uVar5) goto LAB_00173364;
  }
  puStack_418 = (uv_sem_t *)run_test_threadpool_cancel_getnameinfo;
  timer_cb_cold_1();
  iVar6 = 0x50;
  pcStack_1990 = (code *)0x1733be;
  puStack_420 = puVar4;
  puStack_418 = req;
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&sStack_1980);
  if (iVar1 == 0) {
    req = auStack_18c8;
    pvStack_1968 = (void *)0x52800000004;
    pcStack_1990 = (code *)0x1733e7;
    puStack_1970 = req;
    puVar4 = (uv_sem_t *)uv_default_loop();
    pcStack_1990 = (code *)0x1733ef;
    saturate_threadpool();
    addr = (code *)&sStack_1980;
    pcStack_1990 = (code *)0x173409;
    puVar8 = req;
    iVar1 = uv_getnameinfo((uv_loop_t *)puVar4,(uv_getnameinfo_t *)req,getnameinfo_cb,
                           (sockaddr *)addr,0);
    iVar6 = (int)puVar8;
    if (iVar1 != 0) goto LAB_00173515;
    puVar9 = &uStack_13a0;
    addr = (code *)&sStack_1980;
    pcStack_1990 = (code *)0x173430;
    iVar1 = uv_getnameinfo((uv_loop_t *)puVar4,puVar9,getnameinfo_cb,(sockaddr *)addr,0);
    iVar6 = (int)puVar9;
    if (iVar1 != 0) goto LAB_0017351a;
    puVar9 = &uStack_e78;
    addr = (code *)&sStack_1980;
    pcStack_1990 = (code *)0x173457;
    iVar1 = uv_getnameinfo((uv_loop_t *)puVar4,puVar9,getnameinfo_cb,(sockaddr *)addr,0);
    iVar6 = (int)puVar9;
    if (iVar1 != 0) goto LAB_0017351f;
    puVar9 = &uStack_950;
    addr = (code *)&sStack_1980;
    pcStack_1990 = (code *)0x17347e;
    iVar1 = uv_getnameinfo((uv_loop_t *)puVar4,puVar9,getnameinfo_cb,(sockaddr *)addr,0);
    iVar6 = (int)puVar9;
    if (iVar1 != 0) goto LAB_00173524;
    req = auStack_1960;
    pcStack_1990 = (code *)0x173496;
    puVar8 = req;
    iVar1 = uv_timer_init((uv_loop_t *)puVar4,(uv_timer_t *)req);
    iVar6 = (int)puVar8;
    if (iVar1 != 0) goto LAB_00173529;
    iVar6 = 0x17333b;
    addr = (code *)0x0;
    pcStack_1990 = (code *)0x1734b4;
    iVar1 = uv_timer_start((uv_timer_t *)req,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_0017352e;
    iVar6 = 0;
    pcStack_1990 = (code *)0x1734c2;
    iVar1 = uv_run((uv_loop_t *)puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00173533;
    if (timer_cb_called != 1) goto LAB_00173538;
    pcStack_1990 = (code *)0x1734d4;
    puVar4 = (uv_sem_t *)uv_default_loop();
    pcStack_1990 = (code *)0x1734e8;
    uv_walk((uv_loop_t *)puVar4,close_walk_cb,(void *)0x0);
    iVar6 = 0;
    pcStack_1990 = (code *)0x1734f2;
    uv_run((uv_loop_t *)puVar4,UV_RUN_DEFAULT);
    pcStack_1990 = (code *)0x1734f7;
    puVar2 = uv_default_loop();
    pcStack_1990 = (code *)0x1734ff;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_1990 = (code *)0x173515;
    run_test_threadpool_cancel_getnameinfo_cold_1();
LAB_00173515:
    pcStack_1990 = (code *)0x17351a;
    run_test_threadpool_cancel_getnameinfo_cold_2();
LAB_0017351a:
    pcStack_1990 = (code *)0x17351f;
    run_test_threadpool_cancel_getnameinfo_cold_3();
LAB_0017351f:
    pcStack_1990 = (code *)0x173524;
    run_test_threadpool_cancel_getnameinfo_cold_4();
LAB_00173524:
    pcStack_1990 = (code *)0x173529;
    run_test_threadpool_cancel_getnameinfo_cold_5();
LAB_00173529:
    pcStack_1990 = (code *)0x17352e;
    run_test_threadpool_cancel_getnameinfo_cold_6();
LAB_0017352e:
    pcStack_1990 = (code *)0x173533;
    run_test_threadpool_cancel_getnameinfo_cold_7();
LAB_00173533:
    pcStack_1990 = (code *)0x173538;
    run_test_threadpool_cancel_getnameinfo_cold_8();
LAB_00173538:
    pcStack_1990 = (code *)0x17353d;
    run_test_threadpool_cancel_getnameinfo_cold_9();
  }
  pcStack_1990 = getnameinfo_cb;
  run_test_threadpool_cancel_getnameinfo_cold_10();
  if (iVar6 == -0xbbb) {
    if (extraout_RDX_00 != 0) goto LAB_0017355c;
    if ((sockaddr_in *)addr == (sockaddr_in *)0x0) {
      return extraout_EAX_01;
    }
  }
  else {
    auStack_1a40._168_8_ = (__pthread_internal_list *)0x17355c;
    getnameinfo_cb_cold_1();
LAB_0017355c:
    auStack_1a40._168_8_ = (__pthread_internal_list *)0x173561;
    getnameinfo_cb_cold_2();
  }
  auStack_1a40._168_8_ = run_test_threadpool_cancel_random;
  getnameinfo_cb_cold_3();
  auStack_1a40._168_8_ = work_cb;
  pcStack_1a50 = (code *)0x173577;
  auStack_1a40._152_8_ = puVar4;
  auStack_1a40._160_8_ = req;
  saturate_threadpool();
  pcStack_1a50 = (code *)0x17357c;
  puVar3 = uv_default_loop();
  req_01 = (uv_random_t *)auStack_1a40;
  lVar10 = 1;
  pcStack_1a50 = (code *)0x1735a3;
  puVar2 = puVar3;
  iVar1 = uv_random(puVar3,req_01,auStack_1a40 + 0x90,1,0,nop_random_cb);
  iVar6 = (int)req_01;
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)auStack_1a40;
    pcStack_1a50 = (code *)0x1735b5;
    iVar1 = uv_cancel((uv_req_t *)puVar2);
    if (iVar1 != 0) goto LAB_00173649;
    if (done_cb_called == 0) {
      lVar11 = 0;
      puVar4 = pause_sems;
      do {
        pcStack_1a50 = (code *)0x1735dd;
        uv_sem_post((uv_sem_t *)((long)pause_sems + lVar11));
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x80);
      iVar6 = 0;
      pcStack_1a50 = (code *)0x1735f4;
      puVar2 = puVar3;
      iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
      req = (uv_sem_t *)0x80;
      if (iVar1 == 0) {
        if (done_cb_called != 1) goto LAB_00173658;
        pcStack_1a50 = (code *)0x173606;
        puVar3 = uv_default_loop();
        pcStack_1a50 = (code *)0x17361a;
        uv_walk(puVar3,close_walk_cb,(void *)0x0);
        iVar6 = 0;
        pcStack_1a50 = (code *)0x173624;
        uv_run(puVar3,UV_RUN_DEFAULT);
        pcStack_1a50 = (code *)0x173629;
        puVar2 = uv_default_loop();
        pcStack_1a50 = (code *)0x173631;
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
LAB_00173653:
        pcStack_1a50 = (code *)0x173658;
        run_test_threadpool_cancel_random_cold_4();
LAB_00173658:
        pcStack_1a50 = (code *)0x17365d;
        run_test_threadpool_cancel_random_cold_5();
      }
      pcStack_1a50 = nop_random_cb;
      run_test_threadpool_cancel_random_cold_6();
      if (iVar6 == -0x7d) {
        if ((undefined1 *)((long)&puVar2->wq_mutex + 8) != extraout_RDX_01) goto LAB_00173687;
        if (lVar10 == 1) {
          done_cb_called = done_cb_called + 1;
          return extraout_EAX_02;
        }
      }
      else {
        puStack_1a58 = (uv_sem_t *)0x173687;
        nop_random_cb_cold_1();
LAB_00173687:
        puStack_1a58 = (uv_sem_t *)0x17368c;
        nop_random_cb_cold_2();
      }
      puStack_1a58 = (uv_sem_t *)run_test_threadpool_cancel_work;
      nop_random_cb_cold_3();
      pcStack_1a68 = done_cb;
      puStack_1a70 = puVar3;
      puStack_1a60 = req;
      puStack_1a58 = puVar4;
      puVar2 = uv_default_loop();
      saturate_threadpool();
      lVar10 = 0;
      do {
        iVar1 = uv_queue_work(puVar2,(uv_work_t *)((long)auStack_2278[0].reserved + lVar10 + -0x10),
                              work2_cb,done2_cb);
        if (iVar1 != 0) {
          run_test_threadpool_cancel_work_cold_1();
LAB_001737a3:
          run_test_threadpool_cancel_work_cold_2();
LAB_001737a8:
          run_test_threadpool_cancel_work_cold_3();
LAB_001737ad:
          run_test_threadpool_cancel_work_cold_4();
LAB_001737b2:
          run_test_threadpool_cancel_work_cold_5();
          goto LAB_001737b7;
        }
        lVar10 = lVar10 + 0x80;
      } while (lVar10 != 0x800);
      iVar1 = uv_timer_init(puVar2,&uStack_2310);
      if (iVar1 != 0) goto LAB_001737a3;
      iVar1 = uv_timer_start(&uStack_2310,timer_cb,10,0);
      if (iVar1 != 0) goto LAB_001737a8;
      iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
      if (iVar1 != 0) goto LAB_001737ad;
      if (timer_cb_called != 1) goto LAB_001737b2;
      if (done2_cb_called == 0x10) {
        puVar2 = uv_default_loop();
        uv_walk(puVar2,close_walk_cb,(void *)0x0);
        uv_run(puVar2,UV_RUN_DEFAULT);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          return 0;
        }
        goto LAB_001737bc;
      }
LAB_001737b7:
      run_test_threadpool_cancel_work_cold_6();
LAB_001737bc:
      run_test_threadpool_cancel_work_cold_7();
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
              ,0x75,"0 && \"work2_cb called\"");
      abort();
    }
  }
  else {
    pcStack_1a50 = (code *)0x173649;
    run_test_threadpool_cancel_random_cold_1();
LAB_00173649:
    pcStack_1a50 = (code *)0x17364e;
    run_test_threadpool_cancel_random_cold_2();
  }
  pcStack_1a50 = (code *)0x173653;
  run_test_threadpool_cancel_random_cold_3();
  puVar4 = (uv_sem_t *)work_cb;
  goto LAB_00173653;
}

Assistant:

TEST_IMPL(threadpool_cancel_getaddrinfo) {
  uv_getaddrinfo_t reqs[4];
  struct cancel_info ci;
  struct addrinfo hints;
  uv_loop_t* loop;
  int r;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  r = uv_getaddrinfo(loop, reqs + 0, getaddrinfo_cb, "fail", NULL, NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 1, getaddrinfo_cb, NULL, "fail", NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 2, getaddrinfo_cb, "fail", "fail", NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 3, getaddrinfo_cb, "fail", NULL, &hints);
  ASSERT(r == 0);

  ASSERT(0 == uv_timer_init(loop, &ci.timer_handle));
  ASSERT(0 == uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}